

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_binarymodelserialiser.cpp
# Opt level: O0

void __thiscall tst_BinaryModelSerialiser::basicSaveLoadStream(tst_BinaryModelSerialiser *this)

{
  QAbstractItemModel *a;
  QAbstractItemModel *b;
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  QModelIndex local_d8;
  QModelIndex local_c0;
  QDataStream local_a8 [8];
  QDataStream readStream;
  QFlags<QIODeviceBase::OpenModeFlag> local_84;
  QDataStream local_80 [8];
  QDataStream writeStream;
  undefined1 local_60 [8];
  QByteArray dataArray;
  BinaryModelSerialiser local_38 [8];
  BinaryModelSerialiser serialiser;
  QAbstractItemModel *destinationModel;
  QAbstractItemModel *sourceModel;
  tst_BinaryModelSerialiser *this_local;
  
  iVar2 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar3 = (undefined8 *)QTest::qData("sourceModel",iVar2);
  a = (QAbstractItemModel *)*puVar3;
  iVar2 = qMetaTypeId<QAbstractItemModel*>();
  puVar3 = (undefined8 *)QTest::qData("destinationModel",iVar2);
  b = (QAbstractItemModel *)*puVar3;
  BinaryModelSerialiser::BinaryModelSerialiser(local_38,a,(QObject *)0x0);
  AbstractModelSerialiser::addRoleToSave((int)local_38);
  QByteArray::QByteArray((QByteArray *)local_60);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_84,WriteOnly);
  QDataStream::QDataStream(local_80,(QByteArray *)local_60,(QFlags_conflict *)(ulong)local_84.i);
  bVar1 = BinaryModelSerialiser::saveModel((QDataStream *)local_38);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser.saveModel(writeStream)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_BinaryModelSerialiser/tst_binarymodelserialiser.cpp"
                         ,0x2d);
  if ((bVar1 & 1) != 0) {
    QDataStream::QDataStream(local_a8,(QByteArray *)local_60);
    AbstractModelSerialiser::setModel((QAbstractItemModel *)local_38);
    bVar1 = BinaryModelSerialiser::loadModel((QDataStream *)local_38);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser.loadModel(readStream)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_BinaryModelSerialiser/tst_binarymodelserialiser.cpp"
                           ,0x30);
    if ((bVar1 & 1) != 0) {
      QModelIndex::QModelIndex(&local_c0);
      QModelIndex::QModelIndex(&local_d8);
      tst_SerialiserCommon::checkModelEqual
                (&this->super_tst_SerialiserCommon,a,b,&local_c0,&local_d8,true);
      QObject::deleteLater();
    }
    QDataStream::~QDataStream(local_a8);
  }
  QDataStream::~QDataStream(local_80);
  QByteArray::~QByteArray((QByteArray *)local_60);
  BinaryModelSerialiser::~BinaryModelSerialiser(local_38);
  return;
}

Assistant:

void tst_BinaryModelSerialiser::basicSaveLoadStream()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    BinaryModelSerialiser serialiser(sourceModel, nullptr);
    serialiser.addRoleToSave(Qt::UserRole + 1);
    QByteArray dataArray;
    QDataStream writeStream(&dataArray, QIODevice::WriteOnly);
    QVERIFY(serialiser.saveModel(writeStream));
    QDataStream readStream(dataArray);
    serialiser.setModel(destinationModel);
    QVERIFY(serialiser.loadModel(readStream));
    checkModelEqual(sourceModel, destinationModel);
    destinationModel->deleteLater();
}